

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstructCondense<double>::ComputeWeightsLocal
          (TPZDohrSubstructCondense<double> *this,TPZFMatrix<double> *StiffnessDiagLocal)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  mapped_type *pmVar8;
  long newRows;
  ulong uVar9;
  long lVar10;
  long lVar11;
  key_type local_38;
  
  local_38.first = ExternalFirst;
  local_38.second = Submesh;
  pmVar8 = std::
           map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
           ::operator[](&this->fPermutationsScatter,&local_38);
  uVar1 = this->fNumExternalEquations;
  newRows = (long)(int)uVar1;
  if (newRows < 1) {
    uVar7 = 0;
  }
  else {
    piVar3 = pmVar8->fStore;
    pdVar4 = (this->fWeights).super_TPZVec<double>.fStore;
    lVar11 = 0;
    do {
      if (((StiffnessDiagLocal->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar11) ||
         ((StiffnessDiagLocal->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[piVar3[lVar11]] = pdVar4[piVar3[lVar11]] / StiffnessDiagLocal->fElem[lVar11];
      lVar11 = lVar11 + 1;
      uVar7 = uVar1;
    } while (newRows != lVar11);
  }
  uVar2 = this->fNEquations;
  if ((int)uVar7 < (int)uVar2) {
    piVar3 = pmVar8->fStore;
    pdVar4 = (this->fWeights).super_TPZVec<double>.fStore;
    uVar9 = (ulong)uVar7;
    do {
      pdVar4[piVar3[uVar9]] = 1.0;
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  local_38.first = ExternalFirst;
  local_38.second = Submesh;
  pmVar8 = std::
           map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
           ::operator[](&this->fPermutationsScatter,&local_38);
  uVar7 = (uint)(this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  TPZFMatrix<double>::Resize(&this->fPhiC_Weighted_Condensed,newRows,(long)(int)uVar7);
  if (0 < (int)uVar1) {
    lVar11 = 0;
    do {
      if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          lVar10 = (long)pmVar8->fStore[lVar11];
          if (((lVar10 < 0) ||
              (lVar5 = (this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
              lVar5 <= lVar10)) ||
             ((this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
          if ((lVar6 <= lVar11) ||
             ((this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <=
              (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (this->fPhiC_Weighted_Condensed).fElem[lVar6 * uVar9 + lVar11] =
               (this->fPhiC).fElem[lVar5 * uVar9 + lVar10] *
               (this->fWeights).super_TPZVec<double>.fStore[lVar10];
          uVar9 = uVar9 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar9);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != newRows);
  }
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	//fWeights.Fill(1.);
	TPZVec<int> &scatter = ScatterVec(ExternalFirst, Submesh);
	int neqs = fNumExternalEquations;
	for (i=0;i<neqs;i++) {
		fWeights[scatter[i]] = fWeights[scatter[i]] / StiffnessDiagLocal(i,0);
	}
	for(; i<fNEquations; i++)
	{
		fWeights[scatter[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	TPZVec<int> &gather = GatherVec(Submesh, ExternalFirst);
	int c,nc = fPhiC.Cols();
	fPhiC_Weighted_Condensed.Resize(neqs,nc);
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			fPhiC_Weighted_Condensed(i,c) = fPhiC(gather[i],c)*fWeights[gather[i]];
		}
	}
}